

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

object * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,(anonymous_namespace)::MyAlloc<char>>::
object_storage::value_abi_cxx11_(object_storage *this)

{
  assertion_error *this_00;
  allocator<char> local_31;
  string local_30;
  
  if (*(object **)(this + 8) != (object *)0x0) {
    return *(object **)(this + 8);
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"assertion \'ptr_ != nullptr\' failed at  <> :0",&local_31);
  assertion_error::assertion_error(this_00,&local_30);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const object& value() const
            {
                JSONCONS_ASSERT(ptr_ != nullptr);
                return *ptr_;
            }